

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O2

UChar * u_strcat_63(UChar *dst,UChar *src)

{
  short sVar1;
  UChar *pUVar2;
  UChar *pUVar3;
  long lVar4;
  UChar *anchor;
  
  pUVar2 = dst;
  do {
    pUVar3 = pUVar2;
    pUVar2 = pUVar3 + 1;
  } while (*pUVar3 != L'\0');
  lVar4 = 0;
  do {
    sVar1 = *(short *)((long)src + lVar4);
    *(short *)((long)pUVar3 + lVar4) = sVar1;
    lVar4 = lVar4 + 2;
  } while (sVar1 != 0);
  return dst;
}

Assistant:

U_CAPI UChar* U_EXPORT2
u_strcat(UChar     *dst, 
    const UChar     *src)
{
    UChar *anchor = dst;            /* save a pointer to start of dst */

    while(*dst != 0) {              /* To end of first string          */
        ++dst;
    }
    while((*(dst++) = *(src++)) != 0) {     /* copy string 2 over              */
    }

    return anchor;
}